

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_child(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  anon_union_8_3_2f476f46_for_data aVar5;
  bool bVar6;
  Machine *pMVar7;
  Interpreter *pIVar8;
  long *plVar9;
  undefined8 *puVar10;
  anon_union_8_3_2f476f46_for_data aVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  size_t sVar14;
  anon_union_8_3_2f476f46_for_data aVar15;
  String filename;
  String pathSep;
  String path;
  Value local_c0;
  Interpreter *local_b0;
  Context *local_a8;
  Value local_a0;
  Value local_90;
  anon_union_8_3_2f476f46_for_data local_80;
  anon_union_8_3_2f476f46_for_data local_78;
  long *local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  undefined1 local_60 [8];
  anon_union_8_3_2f476f46_for_data local_58;
  Machine *local_50;
  anon_union_8_3_2f476f46_for_data local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  anon_union_8_3_2f476f46_for_data local_38;
  
  local_48.tempNum._0_1_ = '\0';
  pMVar7 = (Machine *)operator_new(0x30);
  *(undefined8 *)&pMVar7->storeImplicit = 1;
  pMVar7->standardOutput = (TextOutputMethod)&PTR__StringStorage_001bf0d8;
  *(undefined8 *)&pMVar7->yielding = 0xb;
  (pMVar7->functionType).type = ~Null;
  (pMVar7->functionType).noInvoke = true;
  (pMVar7->functionType).localOnly = ~Off;
  *(undefined5 *)&(pMVar7->functionType).field_0x3 = 0xffffffffff;
  pIVar8 = (Interpreter *)operator_new__(0xb);
  pMVar7->interpreter = pIVar8;
  pIVar8->_vptr_Interpreter = (_func_int **)0x6150746e65726170;
  *(undefined4 *)((long)&pIVar8->_vptr_Interpreter + 7) = 0x687461;
  local_50 = pMVar7;
  MiniScript::Context::GetVar
            ((Context *)&local_c0,(String *)partialResult.rs,(LocalOnlyMode)&local_50);
  MiniScript::Value::ToString((Value *)&local_40,(Machine *)&local_c0);
  if ((Temp < local_c0.type) && (local_c0.data.ref != (RefCountedStorage *)0x0)) {
    plVar9 = &(local_c0.data.ref)->refCount;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (*(local_c0.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_c0.data.number = 0.0;
  }
  if ((local_50 != (Machine *)0x0) && (local_48.tempNum._0_1_ == '\0')) {
    pbVar1 = &local_50->storeImplicit;
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 == 0) {
      (**(code **)(local_50->standardOutput + 8))();
    }
    local_50 = (Machine *)0x0;
  }
  local_68.tempNum._0_1_ = '\0';
  plVar9 = (long *)operator_new(0x30);
  plVar9[1] = 1;
  *plVar9 = (long)&PTR__StringStorage_001bf0d8;
  plVar9[3] = 10;
  plVar9[4] = -1;
  puVar10 = (undefined8 *)operator_new__(10);
  plVar9[2] = (long)puVar10;
  *puVar10 = 0x6d614e646c696863;
  *(undefined2 *)(puVar10 + 1) = 0x65;
  local_70 = plVar9;
  MiniScript::Context::GetVar
            ((Context *)local_60,(String *)partialResult.rs,(LocalOnlyMode)&local_70);
  MiniScript::Value::ToString(&local_c0,(Machine *)local_60);
  if ((Temp < local_60[0]) && (local_58.ref != (RefCountedStorage *)0x0)) {
    plVar9 = &(local_58.ref)->refCount;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (*(local_58.ref)->_vptr_RefCountedStorage[1])();
    }
    local_58.number = 0.0;
  }
  if ((local_70 != (long *)0x0) && (local_68.tempNum._0_1_ == '\0')) {
    plVar9 = local_70 + 1;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
  }
  local_78.tempNum._0_1_ = '\0';
  aVar11.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar11.ref)->refCount = 1;
  (aVar11.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
  aVar11.ref[1].refCount = 2;
  aVar11.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var12 = (_func_int **)operator_new__(2);
  aVar11.ref[1]._vptr_RefCountedStorage = pp_Var12;
  *(undefined2 *)pp_Var12 = 0x2f;
  local_80.ref = aVar11.ref;
  bVar6 = MiniScript::String::EndsWith((String *)&local_40,(String *)&local_80);
  aVar5 = local_40;
  aVar11 = local_80;
  if (bVar6) {
    aVar15._1_1_ = local_c0.noInvoke;
    aVar15._2_1_ = local_c0.localOnly;
    aVar15._3_5_ = local_c0._3_5_;
    aVar15.tempNum._0_1_ = local_c0.type;
    if (aVar15.ref == (RefCountedStorage *)0x0) {
      if (local_40.ref == (RefCountedStorage *)0x0) {
        aVar15.number = 0.0;
      }
      else {
        (local_40.ref)->refCount = (local_40.ref)->refCount + 1;
        aVar15 = local_40;
      }
    }
    else if (local_40.ref == (RefCountedStorage *)0x0) {
      (aVar15.ref)->refCount = (aVar15.ref)->refCount + 1;
    }
    else {
      lVar3 = local_40.ref[1].refCount;
      pIVar8 = (Interpreter *)aVar15.ref[1].refCount;
      local_a8 = context;
      aVar11.ref = (RefCountedStorage *)operator_new(0x30);
      uVar13 = (long)pIVar8 + lVar3 + -1;
      (aVar11.ref)->refCount = 1;
      (aVar11.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
      aVar11.ref[1].refCount = uVar13;
      aVar11.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      local_b0 = pIVar8;
      pp_Var12 = (_func_int **)operator_new__(uVar13);
      sVar14 = lVar3 - 1;
      aVar11.ref[1]._vptr_RefCountedStorage = pp_Var12;
      memset(pp_Var12,0,uVar13);
      memcpy(pp_Var12,aVar5.ref[1]._vptr_RefCountedStorage,sVar14);
      memcpy((void *)(sVar14 + (long)pp_Var12),aVar15.ref[1]._vptr_RefCountedStorage,
             (size_t)local_b0);
      context = local_a8;
      aVar15.ref = aVar11.ref;
    }
    local_90.type = String;
    local_90.noInvoke = false;
    local_90.localOnly = Off;
    local_90.data = aVar15;
    if (aVar15.ref == (RefCountedStorage *)0x0) {
      local_90.data = DAT_001c1308;
    }
    if (local_90.data.ref != (RefCountedStorage *)0x0) {
      (local_90.data.ref)->refCount = (local_90.data.ref)->refCount + 1;
    }
    ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3),
               &local_90);
    *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
    if ((Temp < local_90.type) && (local_90.data.ref != (RefCountedStorage *)0x0)) {
      plVar9 = &(local_90.data.ref)->refCount;
      *plVar9 = *plVar9 + -1;
      if (*plVar9 == 0) {
        (*(local_90.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_90.data.number = 0.0;
    }
    goto LAB_00126718;
  }
  if (local_80.ref == (RefCountedStorage *)0x0) {
    if (local_40.ref != (RefCountedStorage *)0x0) {
      (local_40.ref)->refCount = (local_40.ref)->refCount + 1;
      aVar15 = local_40;
      local_a8 = context;
      goto LAB_0012655d;
    }
    aVar11._1_1_ = local_c0.noInvoke;
    aVar11._2_1_ = local_c0.localOnly;
    aVar11._3_5_ = local_c0._3_5_;
    aVar11.tempNum._0_1_ = local_c0.type;
    if (aVar11.ref == (RefCountedStorage *)0x0) {
      aVar15.number = 0.0;
      aVar11.number = 0.0;
    }
    else {
      (aVar11.ref)->refCount = (aVar11.ref)->refCount + 1;
      aVar15.number = 0.0;
    }
  }
  else {
    if (local_40.ref == (RefCountedStorage *)0x0) {
      (local_80.ref)->refCount = (local_80.ref)->refCount + 1;
      aVar15 = local_80;
      local_a8 = context;
    }
    else {
      lVar3 = local_40.ref[1].refCount;
      pIVar8 = (Interpreter *)local_80.ref[1].refCount;
      local_a8 = context;
      aVar15.ref = (RefCountedStorage *)operator_new(0x30);
      uVar13 = (long)pIVar8 + lVar3 + -1;
      (aVar15.ref)->refCount = 1;
      (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
      aVar15.ref[1].refCount = uVar13;
      aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      local_b0 = pIVar8;
      pp_Var12 = (_func_int **)operator_new__(uVar13);
      sVar14 = lVar3 - 1;
      aVar15.ref[1]._vptr_RefCountedStorage = pp_Var12;
      memset(pp_Var12,0,uVar13);
      memcpy(pp_Var12,aVar5.ref[1]._vptr_RefCountedStorage,sVar14);
      memcpy((void *)(sVar14 + (long)pp_Var12),aVar11.ref[1]._vptr_RefCountedStorage,
             (size_t)local_b0);
    }
LAB_0012655d:
    lVar3 = CONCAT71(local_c0._1_7_,local_c0.type);
    if (lVar3 == 0) {
      (aVar15.ref)->refCount = (aVar15.ref)->refCount + 1;
      context = local_a8;
      aVar11 = aVar15;
    }
    else {
      lVar4 = aVar15.ref[1].refCount;
      pIVar8 = *(Interpreter **)(lVar3 + 0x18);
      aVar11.ref = (RefCountedStorage *)operator_new(0x30);
      uVar13 = (long)pIVar8 + lVar4 + -1;
      (aVar11.ref)->refCount = 1;
      (aVar11.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
      aVar11.ref[1].refCount = uVar13;
      aVar11.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      local_b0 = pIVar8;
      pp_Var12 = (_func_int **)operator_new__(uVar13);
      sVar14 = lVar4 - 1;
      aVar11.ref[1]._vptr_RefCountedStorage = pp_Var12;
      memset(pp_Var12,0,uVar13);
      memcpy(pp_Var12,aVar15.ref[1]._vptr_RefCountedStorage,sVar14);
      memcpy((void *)(sVar14 + (long)pp_Var12),*(void **)(lVar3 + 0x10),(size_t)local_b0);
      context = local_a8;
    }
  }
  local_a0.type = String;
  local_a0.noInvoke = false;
  local_a0.localOnly = Off;
  local_a0.data = aVar11;
  if (aVar11.ref == (RefCountedStorage *)0x0) {
    local_a0.data = DAT_001c1308;
  }
  if (local_a0.data.ref != (RefCountedStorage *)0x0) {
    (local_a0.data.ref)->refCount = (local_a0.data.ref)->refCount + 1;
  }
  ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  MiniScript::Value::operator=
            ((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3),&local_a0
            );
  *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
  if ((Temp < local_a0.type) && (local_a0.data.ref != (RefCountedStorage *)0x0)) {
    plVar9 = &(local_a0.data.ref)->refCount;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (*(local_a0.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_a0.data.number = 0.0;
  }
  if (aVar11.ref != (RefCountedStorage *)0x0) {
    plVar9 = &(aVar11.ref)->refCount;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (*(aVar11.ref)->_vptr_RefCountedStorage[1])(aVar11.number);
    }
  }
LAB_00126718:
  if (aVar15.ref != (RefCountedStorage *)0x0) {
    plVar9 = &(aVar15.ref)->refCount;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (*(aVar15.ref)->_vptr_RefCountedStorage[1])(aVar15.number);
    }
  }
  if ((local_80.ref != (RefCountedStorage *)0x0) && (local_78.tempNum._0_1_ == '\0')) {
    plVar9 = &(local_80.ref)->refCount;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (*(local_80.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  plVar9 = (long *)CONCAT71(local_c0._1_7_,local_c0.type);
  if ((plVar9 != (long *)0x0) && ((bool)local_c0.data.tempNum._0_1_ == false)) {
    plVar2 = plVar9 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*plVar9 + 8))();
    }
  }
  if ((local_40.ref != (RefCountedStorage *)0x0) && ((bool)local_38.tempNum._0_1_ == false)) {
    plVar9 = &(local_40.ref)->refCount;
    *plVar9 = *plVar9 + -1;
    if (*plVar9 == 0) {
      (*(local_40.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_child(Context *context, IntrinsicResult partialResult) {
	String path = context->GetVar("parentPath").ToString();
	String filename = context->GetVar("childName").ToString();
	#if _WIN32 || _WIN64
		String pathSep = "\\";
	#else
		String pathSep = "/";
	#endif
	if (path.EndsWith(pathSep)) return IntrinsicResult(path + filename);
	return IntrinsicResult(path + pathSep + filename);
}